

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void run_extrakeys_tests(void)

{
  uchar *b32;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  secp256k1_context *psVar10;
  int iVar11;
  int iVar12;
  secp256k1_ge *pubkey;
  secp256k1_pubkey *pubkey_00;
  char *pcVar13;
  long lVar14;
  secp256k1_ge *pubkey_01;
  char cVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined8 uStack_e40;
  int pk_parity;
  int32_t _calls_to_callback_3;
  void *pvStack_e20;
  undefined4 local_e18;
  undefined4 uStack_e14;
  undefined4 uStack_e10;
  undefined4 uStack_e0c;
  secp256k1_xonly_pubkey xonly_pk;
  uchar buf32 [32];
  uchar xy_sk [32];
  uchar sk [32];
  secp256k1_pubkey pk;
  secp256k1_xonly_pubkey xonly_pk_tmp;
  secp256k1_fe y;
  uchar zeros64 [64];
  int32_t _calls_to_callback_5;
  uchar ones32 [32];
  secp256k1_ge pk2;
  secp256k1_ge pk1;
  secp256k1_pubkey local_b8 [2];
  
  zeros64[0x30] = '\0';
  zeros64[0x31] = '\0';
  zeros64[0x32] = '\0';
  zeros64[0x33] = '\0';
  zeros64[0x34] = '\0';
  zeros64[0x35] = '\0';
  zeros64[0x36] = '\0';
  zeros64[0x37] = '\0';
  zeros64[0x38] = '\0';
  zeros64[0x39] = '\0';
  zeros64[0x3a] = '\0';
  zeros64[0x3b] = '\0';
  zeros64[0x3c] = '\0';
  zeros64[0x3d] = '\0';
  zeros64[0x3e] = '\0';
  zeros64[0x3f] = '\0';
  zeros64[0x20] = '\0';
  zeros64[0x21] = '\0';
  zeros64[0x22] = '\0';
  zeros64[0x23] = '\0';
  zeros64[0x24] = '\0';
  zeros64[0x25] = '\0';
  zeros64[0x26] = '\0';
  zeros64[0x27] = '\0';
  zeros64[0x28] = '\0';
  zeros64[0x29] = '\0';
  zeros64[0x2a] = '\0';
  zeros64[0x2b] = '\0';
  zeros64[0x2c] = '\0';
  zeros64[0x2d] = '\0';
  zeros64[0x2e] = '\0';
  zeros64[0x2f] = '\0';
  zeros64[0x10] = '\0';
  zeros64[0x11] = '\0';
  zeros64[0x12] = '\0';
  zeros64[0x13] = '\0';
  zeros64[0x14] = '\0';
  zeros64[0x15] = '\0';
  zeros64[0x16] = '\0';
  zeros64[0x17] = '\0';
  zeros64[0x18] = '\0';
  zeros64[0x19] = '\0';
  zeros64[0x1a] = '\0';
  zeros64[0x1b] = '\0';
  zeros64[0x1c] = '\0';
  zeros64[0x1d] = '\0';
  zeros64[0x1e] = '\0';
  zeros64[0x1f] = '\0';
  zeros64[0] = '\0';
  zeros64[1] = '\0';
  zeros64[2] = '\0';
  zeros64[3] = '\0';
  zeros64[4] = '\0';
  zeros64[5] = '\0';
  zeros64[6] = '\0';
  zeros64[7] = '\0';
  zeros64[8] = '\0';
  zeros64[9] = '\0';
  zeros64[10] = '\0';
  zeros64[0xb] = '\0';
  zeros64[0xc] = '\0';
  zeros64[0xd] = '\0';
  zeros64[0xe] = '\0';
  zeros64[0xf] = '\0';
  testrand256(sk);
  ones32[0x10] = 0xff;
  ones32[0x11] = 0xff;
  ones32[0x12] = 0xff;
  ones32[0x13] = 0xff;
  ones32[0x14] = 0xff;
  ones32[0x15] = 0xff;
  ones32[0x16] = 0xff;
  ones32[0x17] = 0xff;
  ones32[0x18] = 0xff;
  ones32[0x19] = 0xff;
  ones32[0x1a] = 0xff;
  ones32[0x1b] = 0xff;
  ones32[0x1c] = 0xff;
  ones32[0x1d] = 0xff;
  ones32[0x1e] = 0xff;
  ones32[0x1f] = 0xff;
  ones32[0] = 0xff;
  ones32[1] = 0xff;
  ones32[2] = 0xff;
  ones32[3] = 0xff;
  ones32[4] = 0xff;
  ones32[5] = 0xff;
  ones32[6] = 0xff;
  ones32[7] = 0xff;
  ones32[8] = 0xff;
  ones32[9] = 0xff;
  ones32[10] = 0xff;
  ones32[0xb] = 0xff;
  ones32[0xc] = 0xff;
  ones32[0xd] = 0xff;
  ones32[0xe] = 0xff;
  ones32[0xf] = 0xff;
  testrand256(xy_sk);
  iVar11 = secp256k1_ec_pubkey_create(CTX,&pk,sk);
  if (iVar11 == 0) {
    pcVar13 = "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1";
    uStack_e40 = 0x1d;
  }
  else {
    iVar11 = secp256k1_xonly_pubkey_from_pubkey(CTX,&xonly_pk,&pk_parity,&pk);
    if (iVar11 == 0) {
      pcVar13 = 
      "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
      ;
      uStack_e40 = 0x1e;
    }
    else {
      iVar11 = secp256k1_xonly_pubkey_from_pubkey(CTX,&xonly_pk,&pk_parity,&pk);
      if (iVar11 == 0) {
        pcVar13 = 
        "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
        ;
        uStack_e40 = 0x21;
      }
      else {
        auVar17._12_4_ = 0;
        auVar17._0_12_ = (undefined1  [12])pk2.x.n._4_12_;
        pk2.x.n._0_16_ = auVar17 << 0x20;
        pk1.x.n._0_16_ = CTX->illegal_callback;
        secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&pk2);
        iVar11 = secp256k1_xonly_pubkey_from_pubkey
                           (CTX,(secp256k1_xonly_pubkey *)0x0,&pk_parity,&pk);
        psVar10 = CTX;
        if (iVar11 == 0) {
          (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)pk1.x.n[0];
          (psVar10->illegal_callback).data = (void *)pk1.x.n[1];
          if ((int)pk2.x.n[0] == 1) {
            iVar11 = secp256k1_xonly_pubkey_from_pubkey(psVar10,&xonly_pk,(int *)0x0,&pk);
            if (iVar11 == 0) {
              pcVar13 = 
              "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1"
              ;
              uStack_e40 = 0x23;
              goto LAB_00125c9b;
            }
            auVar1._12_4_ = 0;
            auVar1._0_12_ = (undefined1  [12])pk2.x.n._4_12_;
            pk2.x.n._0_16_ = auVar1 << 0x20;
            pk1.x.n._0_16_ = CTX->illegal_callback;
            secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&pk2);
            iVar11 = secp256k1_xonly_pubkey_from_pubkey
                               (CTX,&xonly_pk,&pk_parity,(secp256k1_pubkey *)0x0);
            psVar10 = CTX;
            if (iVar11 == 0) {
              (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)pk1.x.n[0];
              (psVar10->illegal_callback).data = (void *)pk1.x.n[1];
              if ((int)pk2.x.n[0] == 1) {
                pk.data[0] = '\0';
                pk.data[1] = '\0';
                pk.data[2] = '\0';
                pk.data[3] = '\0';
                pk.data[4] = '\0';
                pk.data[5] = '\0';
                pk.data[6] = '\0';
                pk.data[7] = '\0';
                pk.data[8] = '\0';
                pk.data[9] = '\0';
                pk.data[10] = '\0';
                pk.data[0xb] = '\0';
                pk.data[0xc] = '\0';
                pk.data[0xd] = '\0';
                pk.data[0xe] = '\0';
                pk.data[0xf] = '\0';
                pk.data[0x10] = '\0';
                pk.data[0x11] = '\0';
                pk.data[0x12] = '\0';
                pk.data[0x13] = '\0';
                pk.data[0x14] = '\0';
                pk.data[0x15] = '\0';
                pk.data[0x16] = '\0';
                pk.data[0x17] = '\0';
                pk.data[0x18] = '\0';
                pk.data[0x19] = '\0';
                pk.data[0x1a] = '\0';
                pk.data[0x1b] = '\0';
                pk.data[0x1c] = '\0';
                pk.data[0x1d] = '\0';
                pk.data[0x1e] = '\0';
                pk.data[0x1f] = '\0';
                auVar2._12_4_ = 0;
                auVar2._0_12_ = (undefined1  [12])pk2.x.n._4_12_;
                pk2.x.n._0_16_ = auVar2 << 0x20;
                pk.data[0x20] = '\0';
                pk.data[0x21] = '\0';
                pk.data[0x22] = '\0';
                pk.data[0x23] = '\0';
                pk.data[0x24] = '\0';
                pk.data[0x25] = '\0';
                pk.data[0x26] = '\0';
                pk.data[0x27] = '\0';
                pk.data[0x28] = '\0';
                pk.data[0x29] = '\0';
                pk.data[0x2a] = '\0';
                pk.data[0x2b] = '\0';
                pk.data[0x2c] = '\0';
                pk.data[0x2d] = '\0';
                pk.data[0x2e] = '\0';
                pk.data[0x2f] = '\0';
                pk.data[0x30] = '\0';
                pk.data[0x31] = '\0';
                pk.data[0x32] = '\0';
                pk.data[0x33] = '\0';
                pk.data[0x34] = '\0';
                pk.data[0x35] = '\0';
                pk.data[0x36] = '\0';
                pk.data[0x37] = '\0';
                pk.data[0x38] = '\0';
                pk.data[0x39] = '\0';
                pk.data[0x3a] = '\0';
                pk.data[0x3b] = '\0';
                pk.data[0x3c] = '\0';
                pk.data[0x3d] = '\0';
                pk.data[0x3e] = '\0';
                pk.data[0x3f] = '\0';
                pk1.x.n._0_16_ = psVar10->illegal_callback;
                secp256k1_context_set_illegal_callback(psVar10,counting_callback_fn,&pk2);
                iVar11 = secp256k1_xonly_pubkey_from_pubkey(CTX,&xonly_pk,&pk_parity,&pk);
                psVar10 = CTX;
                if (iVar11 == 0) {
                  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)pk1.x.n[0];
                  (psVar10->illegal_callback).data = (void *)pk1.x.n[1];
                  if ((int)pk2.x.n[0] == 1) {
                    sk[0x10] = '\0';
                    sk[0x11] = '\0';
                    sk[0x12] = '\0';
                    sk[0x13] = '\0';
                    sk[0x14] = '\0';
                    sk[0x15] = '\0';
                    sk[0x16] = '\0';
                    sk[0x17] = '\0';
                    sk[0x18] = '\0';
                    sk[0x19] = '\0';
                    sk[0x1a] = '\0';
                    sk[0x1b] = '\0';
                    sk[0x1c] = '\0';
                    sk[0x1d] = '\0';
                    sk[0x1e] = '\0';
                    sk[0x1f] = '\0';
                    sk._1_15_ = SUB1615((undefined1  [16])0x0,1);
                    sk[0] = '\x01';
                    iVar11 = secp256k1_ec_pubkey_create(psVar10,&pk,sk);
                    if (iVar11 == 0) {
                      pcVar13 = 
                      "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1";
                      uStack_e40 = 0x2b;
                    }
                    else {
                      iVar11 = secp256k1_xonly_pubkey_from_pubkey(CTX,&xonly_pk,&pk_parity,&pk);
                      if (iVar11 == 0) {
                        pcVar13 = 
                        "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
                        ;
                        uStack_e40 = 0x2c;
                      }
                      else {
                        iVar11 = secp256k1_memcmp_var(&pk,&xonly_pk,0x40);
                        if (iVar11 == 0) {
                          if (pk_parity == 0) {
                            sk[0] = '\x02';
                            iVar11 = secp256k1_ec_pubkey_create(CTX,&pk,sk);
                            if (iVar11 == 0) {
                              pcVar13 = 
                              "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1"
                              ;
                              uStack_e40 = 0x33;
                            }
                            else {
                              iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                 (CTX,&xonly_pk,&pk_parity,&pk);
                              if (iVar11 == 0) {
                                pcVar13 = 
                                "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
                                ;
                                uStack_e40 = 0x34;
                              }
                              else {
                                iVar11 = secp256k1_memcmp_var(&xonly_pk,&pk,0x40);
                                if (iVar11 == 0) {
                                  pcVar13 = 
                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, &pk, sizeof(xonly_pk)) != 0"
                                  ;
                                  uStack_e40 = 0x35;
                                }
                                else if (pk_parity == 1) {
                                  secp256k1_pubkey_load(CTX,&pk1,&pk);
                                  secp256k1_pubkey_load(CTX,&pk2,(secp256k1_pubkey *)&xonly_pk);
                                  iVar11 = secp256k1_fe_equal(&pk1.x,&pk2.x);
                                  if (iVar11 == 0) {
                                    pcVar13 = 
                                    "test condition failed: secp256k1_fe_equal(&pk1.x, &pk2.x) == 1"
                                    ;
                                    uStack_e40 = 0x39;
                                  }
                                  else {
                                    secp256k1_fe_negate_unchecked(&y,&pk2.y,1);
                                    iVar11 = secp256k1_fe_equal(&pk1.y,&y);
                                    if (iVar11 == 0) {
                                      pcVar13 = 
                                      "test condition failed: secp256k1_fe_equal(&pk1.y, &y) == 1";
                                      uStack_e40 = 0x3b;
                                    }
                                    else {
                                      __calls_to_callback_3 =
                                           (_func_void_char_ptr_void_ptr *)
                                           ((ulong)__calls_to_callback_3 & 0xffffffff00000000);
                                      xonly_pk_tmp.data._0_16_ = CTX->illegal_callback;
                                      secp256k1_context_set_illegal_callback
                                                (CTX,counting_callback_fn,&_calls_to_callback_3);
                                      iVar11 = secp256k1_xonly_pubkey_serialize
                                                         (CTX,(uchar *)0x0,&xonly_pk);
                                      psVar10 = CTX;
                                      if (iVar11 == 0) {
                                        (CTX->illegal_callback).fn =
                                             (_func_void_char_ptr_void_ptr *)xonly_pk_tmp.data._0_8_
                                        ;
                                        (psVar10->illegal_callback).data =
                                             (void *)xonly_pk_tmp.data._8_8_;
                                        if (_calls_to_callback_3 == 1) {
                                          __calls_to_callback_3 =
                                               (_func_void_char_ptr_void_ptr *)
                                               ((ulong)__calls_to_callback_3 & 0xffffffff00000000);
                                          xonly_pk_tmp.data._0_16_ = psVar10->illegal_callback;
                                          secp256k1_context_set_illegal_callback
                                                    (psVar10,counting_callback_fn,
                                                     &_calls_to_callback_3);
                                          iVar11 = secp256k1_xonly_pubkey_serialize
                                                             (CTX,buf32,
                                                              (secp256k1_xonly_pubkey *)0x0);
                                          psVar10 = CTX;
                                          if (iVar11 == 0) {
                                            (CTX->illegal_callback).fn =
                                                 (_func_void_char_ptr_void_ptr *)
                                                 xonly_pk_tmp.data._0_8_;
                                            (psVar10->illegal_callback).data =
                                                 (void *)xonly_pk_tmp.data._8_8_;
                                            if (_calls_to_callback_3 == 1) {
                                              iVar11 = secp256k1_memcmp_var(buf32,zeros64,0x20);
                                              if (iVar11 != 0) {
                                                pcVar13 = 
                                                "test condition failed: secp256k1_memcmp_var(buf32, zeros64, 32) == 0"
                                                ;
                                                uStack_e40 = 0x40;
                                                goto LAB_00125c9b;
                                              }
                                              xonly_pk_tmp.data[0x30] = '\0';
                                              xonly_pk_tmp.data[0x31] = '\0';
                                              xonly_pk_tmp.data[0x32] = '\0';
                                              xonly_pk_tmp.data[0x33] = '\0';
                                              xonly_pk_tmp.data[0x34] = '\0';
                                              xonly_pk_tmp.data[0x35] = '\0';
                                              xonly_pk_tmp.data[0x36] = '\0';
                                              xonly_pk_tmp.data[0x37] = '\0';
                                              xonly_pk_tmp.data[0x38] = '\0';
                                              xonly_pk_tmp.data[0x39] = '\0';
                                              xonly_pk_tmp.data[0x3a] = '\0';
                                              xonly_pk_tmp.data[0x3b] = '\0';
                                              xonly_pk_tmp.data[0x3c] = '\0';
                                              xonly_pk_tmp.data[0x3d] = '\0';
                                              xonly_pk_tmp.data[0x3e] = '\0';
                                              xonly_pk_tmp.data[0x3f] = '\0';
                                              xonly_pk_tmp.data[0x20] = '\0';
                                              xonly_pk_tmp.data[0x21] = '\0';
                                              xonly_pk_tmp.data[0x22] = '\0';
                                              xonly_pk_tmp.data[0x23] = '\0';
                                              xonly_pk_tmp.data[0x24] = '\0';
                                              xonly_pk_tmp.data[0x25] = '\0';
                                              xonly_pk_tmp.data[0x26] = '\0';
                                              xonly_pk_tmp.data[0x27] = '\0';
                                              xonly_pk_tmp.data[0x28] = '\0';
                                              xonly_pk_tmp.data[0x29] = '\0';
                                              xonly_pk_tmp.data[0x2a] = '\0';
                                              xonly_pk_tmp.data[0x2b] = '\0';
                                              xonly_pk_tmp.data[0x2c] = '\0';
                                              xonly_pk_tmp.data[0x2d] = '\0';
                                              xonly_pk_tmp.data[0x2e] = '\0';
                                              xonly_pk_tmp.data[0x2f] = '\0';
                                              _calls_to_callback_5 = 0;
                                              xonly_pk_tmp.data[0x10] = '\0';
                                              xonly_pk_tmp.data[0x11] = '\0';
                                              xonly_pk_tmp.data[0x12] = '\0';
                                              xonly_pk_tmp.data[0x13] = '\0';
                                              xonly_pk_tmp.data[0x14] = '\0';
                                              xonly_pk_tmp.data[0x15] = '\0';
                                              xonly_pk_tmp.data[0x16] = '\0';
                                              xonly_pk_tmp.data[0x17] = '\0';
                                              xonly_pk_tmp.data[0x18] = '\0';
                                              xonly_pk_tmp.data[0x19] = '\0';
                                              xonly_pk_tmp.data[0x1a] = '\0';
                                              xonly_pk_tmp.data[0x1b] = '\0';
                                              xonly_pk_tmp.data[0x1c] = '\0';
                                              xonly_pk_tmp.data[0x1d] = '\0';
                                              xonly_pk_tmp.data[0x1e] = '\0';
                                              xonly_pk_tmp.data[0x1f] = '\0';
                                              xonly_pk_tmp.data[0] = '\0';
                                              xonly_pk_tmp.data[1] = '\0';
                                              xonly_pk_tmp.data[2] = '\0';
                                              xonly_pk_tmp.data[3] = '\0';
                                              xonly_pk_tmp.data[4] = '\0';
                                              xonly_pk_tmp.data[5] = '\0';
                                              xonly_pk_tmp.data[6] = '\0';
                                              xonly_pk_tmp.data[7] = '\0';
                                              xonly_pk_tmp.data[8] = '\0';
                                              xonly_pk_tmp.data[9] = '\0';
                                              xonly_pk_tmp.data[10] = '\0';
                                              xonly_pk_tmp.data[0xb] = '\0';
                                              xonly_pk_tmp.data[0xc] = '\0';
                                              xonly_pk_tmp.data[0xd] = '\0';
                                              xonly_pk_tmp.data[0xe] = '\0';
                                              xonly_pk_tmp.data[0xf] = '\0';
                                              __calls_to_callback_3 = (psVar10->illegal_callback).fn
                                              ;
                                              pvStack_e20 = (psVar10->illegal_callback).data;
                                              secp256k1_context_set_illegal_callback
                                                        (psVar10,counting_callback_fn,
                                                         &_calls_to_callback_5);
                                              iVar11 = secp256k1_xonly_pubkey_serialize
                                                                 (CTX,buf32,&xonly_pk_tmp);
                                              psVar10 = CTX;
                                              if (iVar11 == 0) {
                                                (CTX->illegal_callback).fn = __calls_to_callback_3;
                                                (psVar10->illegal_callback).data = pvStack_e20;
                                                if (_calls_to_callback_5 == 1) {
                                                  iVar11 = secp256k1_xonly_pubkey_serialize
                                                                     (psVar10,buf32,&xonly_pk);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0x4a;
                                                  goto LAB_00125c9b;
                                                  }
                                                  __calls_to_callback_3 =
                                                       (_func_void_char_ptr_void_ptr *)
                                                       ((ulong)__calls_to_callback_3 &
                                                       0xffffffff00000000);
                                                  xonly_pk_tmp.data._0_16_ = CTX->illegal_callback;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,
                                                             &_calls_to_callback_3);
                                                  iVar11 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,(secp256k1_xonly_pubkey *)
                                                                          0x0,buf32);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         xonly_pk_tmp.data._0_8_;
                                                    (psVar10->illegal_callback).data =
                                                         (void *)xonly_pk_tmp.data._8_8_;
                                                    if (_calls_to_callback_3 == 1) {
                                                      __calls_to_callback_3 =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           ((ulong)__calls_to_callback_3 &
                                                           0xffffffff00000000);
                                                      xonly_pk_tmp.data._0_16_ =
                                                           psVar10->illegal_callback;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar10,counting_callback_fn,
                                                                 &_calls_to_callback_3);
                                                      iVar11 = secp256k1_xonly_pubkey_parse
                                                                         (CTX,&xonly_pk,(uchar *)0x0
                                                                         );
                                                      psVar10 = CTX;
                                                      if (iVar11 == 0) {
                                                        (CTX->illegal_callback).fn =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             xonly_pk_tmp.data._0_8_;
                                                        (psVar10->illegal_callback).data =
                                                             (void *)xonly_pk_tmp.data._8_8_;
                                                        if (_calls_to_callback_3 == 1) {
                                                          iVar11 = 
                                                  secp256k1_xonly_pubkey_from_pubkey
                                                            (psVar10,&xonly_pk,(int *)0x0,&pk);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1"
                                                  ;
                                                  uStack_e40 = 0x4f;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,buf32,&xonly_pk);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0x50;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_parse
                                                                       (CTX,&xonly_pk_tmp,buf32);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk_tmp, buf32) == 1"
                                                  ;
                                                  uStack_e40 = 0x51;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_memcmp_var
                                                                       (&xonly_pk,&xonly_pk_tmp,0x40
                                                                       );
                                                    if (iVar11 == 0) {
                                                      builtin_memcpy(xonly_pk.data + 0x30,
                                                                                                                                          
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x20,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x10,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  iVar11 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,&xonly_pk,ones32);
                                                  if (iVar11 == 0) {
                                                    iVar11 = secp256k1_memcmp_var
                                                                       (&xonly_pk,zeros64,0x40);
                                                    if (iVar11 == 0) {
                                                      builtin_memcpy(xonly_pk.data + 0x30,
                                                                                                                                          
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x20,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x10,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  iVar11 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,&xonly_pk,zeros64);
                                                  if (iVar11 == 0) {
                                                    iVar11 = secp256k1_memcmp_var
                                                                       (&xonly_pk,zeros64,0x40);
                                                    if (iVar11 == 0) {
                                                      b32 = (uchar *)((long)&_calls_to_callback_3 +
                                                                     1);
                                                      for (iVar11 = 0; iVar11 < COUNT;
                                                          iVar11 = iVar11 + 1) {
                                                        testrand256(b32);
                                                        __calls_to_callback_3 =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             CONCAT71(stack0xfffffffffffff1d9,2);
                                                        iVar12 = secp256k1_ec_pubkey_parse
                                                                           (CTX,&pk,(uchar *)&
                                                  _calls_to_callback_3,0x21);
                                                  if (iVar12 == 0) {
                                                    builtin_memcpy(xonly_pk.data + 0x30,
                                                                                                                                      
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x20,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data + 0x10,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  builtin_memcpy(xonly_pk.data,
                                                                                                                                  
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x10);
                                                  iVar12 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,&xonly_pk,b32);
                                                  if (iVar12 != 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 0"
                                                  ;
                                                  uStack_e40 = 0x66;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_memcmp_var
                                                                     (&xonly_pk,zeros64,0x40);
                                                  if (iVar12 != 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x67;
                                                  goto LAB_00125c9b;
                                                  }
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_xonly_pubkey_parse
                                                                       (CTX,&xonly_pk,b32);
                                                    if (iVar12 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 1"
                                                  ;
                                                  uStack_e40 = 0x69;
                                                  goto LAB_00125c9b;
                                                  }
                                                  }
                                                  }
                                                  pk1.y.n[0] = 0;
                                                  pk1.y.n[1] = 0;
                                                  pk1.x.n[4] = 0;
                                                  pk1.x.magnitude = 0;
                                                  pk1.x.normalized = 0;
                                                  pk1.x.n[2] = 0;
                                                  pk1.x.n[3] = 0;
                                                  pk1.x.n[0] = 0;
                                                  pk1.x.n[1] = 0;
                                                  xonly_pk_tmp.data[8] = 0xff;
                                                  xonly_pk_tmp.data[9] = 0xff;
                                                  xonly_pk_tmp.data[10] = 0xff;
                                                  xonly_pk_tmp.data[0xb] = 0xff;
                                                  xonly_pk_tmp.data[0] = 0xff;
                                                  xonly_pk_tmp.data[1] = 0xff;
                                                  xonly_pk_tmp.data[2] = 0xff;
                                                  xonly_pk_tmp.data[3] = 0xff;
                                                  xonly_pk_tmp.data[4] = 0xff;
                                                  xonly_pk_tmp.data[5] = 0xff;
                                                  xonly_pk_tmp.data[6] = 0xff;
                                                  xonly_pk_tmp.data[7] = 0xff;
                                                  xonly_pk_tmp.data[0xc] = 0xff;
                                                  xonly_pk_tmp.data[0xd] = 0xff;
                                                  xonly_pk_tmp.data[0xe] = 0xff;
                                                  xonly_pk_tmp.data[0xf] = 0xff;
                                                  xonly_pk_tmp.data[0x18] = 0xff;
                                                  xonly_pk_tmp.data[0x19] = 0xff;
                                                  xonly_pk_tmp.data[0x1a] = 0xff;
                                                  xonly_pk_tmp.data[0x1b] = 0xff;
                                                  xonly_pk_tmp.data[0x10] = 0xff;
                                                  xonly_pk_tmp.data[0x11] = 0xff;
                                                  xonly_pk_tmp.data[0x12] = 0xff;
                                                  xonly_pk_tmp.data[0x13] = 0xff;
                                                  xonly_pk_tmp.data[0x14] = 0xff;
                                                  xonly_pk_tmp.data[0x15] = 0xff;
                                                  xonly_pk_tmp.data[0x16] = 0xff;
                                                  xonly_pk_tmp.data[0x17] = 0xff;
                                                  xonly_pk_tmp.data[0x1c] = 0xff;
                                                  xonly_pk_tmp.data[0x1d] = 0xff;
                                                  xonly_pk_tmp.data[0x1e] = 0xff;
                                                  xonly_pk_tmp.data[0x1f] = 0xff;
                                                  testrand256((uchar *)&y);
                                                  testrand256(zeros64);
                                                  iVar11 = secp256k1_ec_pubkey_create
                                                                     (CTX,(secp256k1_pubkey *)&pk2,
                                                                      zeros64);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x9d;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk,(int *)sk,
                                                                        (secp256k1_pubkey *)&pk2);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0x9e;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,(uchar *)&y);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0xa0;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,(uchar *)&y);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0xa1;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,(uchar *)&y);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0xa2;
                                                  }
                                                  else {
                                                    xy_sk._0_8_ = xy_sk._0_8_ & 0xffffffff00000000;
                                                    __calls_to_callback_3 =
                                                         (CTX->illegal_callback).fn;
                                                    pvStack_e20 = (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,xy_sk);
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)0x0,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,(uchar *)&y);
                                                    psVar10 = CTX;
                                                    if (iVar11 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           __calls_to_callback_3;
                                                      (psVar10->illegal_callback).data = pvStack_e20
                                                      ;
                                                      if (xy_sk._0_4_ == 1) {
                                                        xy_sk._0_8_ = xy_sk._0_8_ &
                                                                      0xffffffff00000000;
                                                        __calls_to_callback_3 =
                                                             (psVar10->illegal_callback).fn;
                                                        pvStack_e20 = (psVar10->illegal_callback).
                                                                      data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar10,counting_callback_fn,
                                                                   xy_sk);
                                                        iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                           (CTX,(secp256k1_pubkey *)
                                                                                &xonly_pk,
                                                                            (secp256k1_xonly_pubkey
                                                                             *)0x0,(uchar *)&y);
                                                        psVar10 = CTX;
                                                        if (iVar11 == 0) {
                                                          (CTX->illegal_callback).fn =
                                                               __calls_to_callback_3;
                                                          (psVar10->illegal_callback).data =
                                                               pvStack_e20;
                                                          if (xy_sk._0_4_ == 1) {
                                                            iVar11 = secp256k1_memcmp_var
                                                                               (&xonly_pk,&pk1,0x40)
                                                            ;
                                                            if (iVar11 != 0) {
                                                              pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0xa6;
                                                  goto LAB_00125c9b;
                                                  }
                                                  xy_sk._0_8_ = xy_sk._0_8_ & 0xffffffff00000000;
                                                  __calls_to_callback_3 =
                                                       (psVar10->illegal_callback).fn;
                                                  pvStack_e20 = (psVar10->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (psVar10,counting_callback_fn,xy_sk);
                                                  iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          &xonly_pk,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      (uchar *)0x0);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         __calls_to_callback_3;
                                                    (psVar10->illegal_callback).data = pvStack_e20;
                                                    if (xy_sk._0_4_ == 1) {
                                                      iVar11 = secp256k1_memcmp_var
                                                                         (&xonly_pk,&pk1,0x40);
                                                      if (iVar11 == 0) {
                                                        iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                           (psVar10,(
                                                  secp256k1_pubkey *)&xonly_pk,
                                                  (secp256k1_xonly_pubkey *)&pk,xonly_pk_tmp.data);
                                                  if (iVar11 == 0) {
                                                    iVar11 = secp256k1_memcmp_var
                                                                       (&xonly_pk,&pk1,0x40);
                                                    if (iVar11 == 0) {
                                                      iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                         (CTX,(secp256k1_pubkey *)
                                                                              &xonly_pk,
                                                                          (secp256k1_xonly_pubkey *)
                                                                          &pk,(uchar *)&pk1);
                                                      if (iVar11 == 0) {
                                                        pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, zeros64) == 1"
                                                  ;
                                                  uStack_e40 = 0xb0;
                                                  }
                                                  else {
                                                    for (iVar11 = 0; iVar11 < COUNT;
                                                        iVar11 = iVar11 + 1) {
                                                      secp256k1_scalar_set_b32
                                                                ((secp256k1_scalar *)
                                                                 &_calls_to_callback_3,zeros64,
                                                                 (int *)0x0);
                                                      secp256k1_scalar_negate
                                                                ((secp256k1_scalar *)
                                                                 &_calls_to_callback_3,
                                                                 (secp256k1_scalar *)
                                                                 &_calls_to_callback_3);
                                                      secp256k1_scalar_get_b32
                                                                ((uchar *)&y,
                                                                 (secp256k1_scalar *)
                                                                 &_calls_to_callback_3);
                                                      iVar12 = secp256k1_xonly_pubkey_tweak_add
                                                                         (CTX,(secp256k1_pubkey *)
                                                                              &xonly_pk,
                                                                          (secp256k1_xonly_pubkey *)
                                                                          &pk,zeros64);
                                                      if ((iVar12 != 0) &&
                                                         (iVar12 = secp256k1_xonly_pubkey_tweak_add
                                                                             (CTX,(secp256k1_pubkey
                                                                                   *)&xonly_pk,
                                                                              (
                                                  secp256k1_xonly_pubkey *)&pk,(uchar *)&y),
                                                  iVar12 != 0)) {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, sk) == 0) || (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 0)"
                                                  ;
                                                  uStack_e40 = 0xbb;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_memcmp_var
                                                                     ((secp256k1_pubkey *)&xonly_pk,
                                                                      &pk1,0x40);
                                                  if (iVar12 != 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0xbc;
                                                  goto LAB_00125c9b;
                                                  }
                                                  }
                                                  pk.data[0x30] = '\0';
                                                  pk.data[0x31] = '\0';
                                                  pk.data[0x32] = '\0';
                                                  pk.data[0x33] = '\0';
                                                  pk.data[0x34] = '\0';
                                                  pk.data[0x35] = '\0';
                                                  pk.data[0x36] = '\0';
                                                  pk.data[0x37] = '\0';
                                                  pk.data[0x38] = '\0';
                                                  pk.data[0x39] = '\0';
                                                  pk.data[0x3a] = '\0';
                                                  pk.data[0x3b] = '\0';
                                                  pk.data[0x3c] = '\0';
                                                  pk.data[0x3d] = '\0';
                                                  pk.data[0x3e] = '\0';
                                                  pk.data[0x3f] = '\0';
                                                  pk.data[0x20] = '\0';
                                                  pk.data[0x21] = '\0';
                                                  pk.data[0x22] = '\0';
                                                  pk.data[0x23] = '\0';
                                                  pk.data[0x24] = '\0';
                                                  pk.data[0x25] = '\0';
                                                  pk.data[0x26] = '\0';
                                                  pk.data[0x27] = '\0';
                                                  pk.data[0x28] = '\0';
                                                  pk.data[0x29] = '\0';
                                                  pk.data[0x2a] = '\0';
                                                  pk.data[0x2b] = '\0';
                                                  pk.data[0x2c] = '\0';
                                                  pk.data[0x2d] = '\0';
                                                  pk.data[0x2e] = '\0';
                                                  pk.data[0x2f] = '\0';
                                                  pk.data[0x10] = '\0';
                                                  pk.data[0x11] = '\0';
                                                  pk.data[0x12] = '\0';
                                                  pk.data[0x13] = '\0';
                                                  pk.data[0x14] = '\0';
                                                  pk.data[0x15] = '\0';
                                                  pk.data[0x16] = '\0';
                                                  pk.data[0x17] = '\0';
                                                  pk.data[0x18] = '\0';
                                                  pk.data[0x19] = '\0';
                                                  pk.data[0x1a] = '\0';
                                                  pk.data[0x1b] = '\0';
                                                  pk.data[0x1c] = '\0';
                                                  pk.data[0x1d] = '\0';
                                                  pk.data[0x1e] = '\0';
                                                  pk.data[0x1f] = '\0';
                                                  pk.data[0] = '\0';
                                                  pk.data[1] = '\0';
                                                  pk.data[2] = '\0';
                                                  pk.data[3] = '\0';
                                                  pk.data[4] = '\0';
                                                  pk.data[5] = '\0';
                                                  pk.data[6] = '\0';
                                                  pk.data[7] = '\0';
                                                  pk.data[8] = '\0';
                                                  pk.data[9] = '\0';
                                                  pk.data[10] = '\0';
                                                  pk.data[0xb] = '\0';
                                                  pk.data[0xc] = '\0';
                                                  pk.data[0xd] = '\0';
                                                  pk.data[0xe] = '\0';
                                                  pk.data[0xf] = '\0';
                                                  testrand256((uchar *)&y);
                                                  xy_sk._0_8_ = xy_sk._0_8_ & 0xffffffff00000000;
                                                  __calls_to_callback_3 = (CTX->illegal_callback).fn
                                                  ;
                                                  pvStack_e20 = (CTX->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,xy_sk);
                                                  iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          &xonly_pk,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      (uchar *)&y);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         __calls_to_callback_3;
                                                    (psVar10->illegal_callback).data = pvStack_e20;
                                                    if (xy_sk._0_4_ == 1) {
                                                      iVar11 = secp256k1_memcmp_var
                                                                         (&xonly_pk,&pk1,0x40);
                                                      if (iVar11 == 0) {
                                                        pk1.y.n[0] = 0;
                                                        pk1.y.n[1] = 0;
                                                        pk1.x.n[4] = 0;
                                                        pk1.x.magnitude = 0;
                                                        pk1.x.normalized = 0;
                                                        pk1.x.n[2] = 0;
                                                        pk1.x.n[3] = 0;
                                                        pk1.x.n[0] = 0;
                                                        pk1.x.n[1] = 0;
                                                        zeros64[8] = 0xff;
                                                        zeros64[9] = 0xff;
                                                        zeros64[10] = 0xff;
                                                        zeros64[0xb] = 0xff;
                                                        zeros64[0] = 0xff;
                                                        zeros64[1] = 0xff;
                                                        zeros64[2] = 0xff;
                                                        zeros64[3] = 0xff;
                                                        zeros64[4] = 0xff;
                                                        zeros64[5] = 0xff;
                                                        zeros64[6] = 0xff;
                                                        zeros64[7] = 0xff;
                                                        zeros64[0xc] = 0xff;
                                                        zeros64[0xd] = 0xff;
                                                        zeros64[0xe] = 0xff;
                                                        zeros64[0xf] = 0xff;
                                                        zeros64[0x18] = 0xff;
                                                        zeros64[0x19] = 0xff;
                                                        zeros64[0x1a] = 0xff;
                                                        zeros64[0x1b] = 0xff;
                                                        zeros64[0x10] = 0xff;
                                                        zeros64[0x11] = 0xff;
                                                        zeros64[0x12] = 0xff;
                                                        zeros64[0x13] = 0xff;
                                                        zeros64[0x14] = 0xff;
                                                        zeros64[0x15] = 0xff;
                                                        zeros64[0x16] = 0xff;
                                                        zeros64[0x17] = 0xff;
                                                        zeros64[0x1c] = 0xff;
                                                        zeros64[0x1d] = 0xff;
                                                        zeros64[0x1e] = 0xff;
                                                        zeros64[0x1f] = 0xff;
                                                        testrand256(xy_sk);
                                                        testrand256((uchar *)&y);
                                                        iVar11 = secp256k1_ec_pubkey_create
                                                                           (psVar10,(
                                                  secp256k1_pubkey *)&pk2,(uchar *)&y);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &internal_pk, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0xd6;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk,(int *)buf32,
                                                                        (secp256k1_pubkey *)&pk2);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, &pk_parity, &internal_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0xd7;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0xd9;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,
                                                                        (secp256k1_pubkey *)
                                                                        &xonly_pk);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0xda;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,sk,&xonly_pk_tmp);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &output_xonly_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0xdb;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,sk,buf32._0_4_,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0xdc;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,sk,buf32._0_4_,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0xdd;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,sk,buf32._0_4_,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0xde;
                                                  }
                                                  else {
                                                    ones32[0] = '\0';
                                                    ones32[1] = '\0';
                                                    ones32[2] = '\0';
                                                    ones32[3] = '\0';
                                                    __calls_to_callback_3 =
                                                         (CTX->illegal_callback).fn;
                                                    pvStack_e20 = (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,ones32);
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,(uchar *)0x0,buf32._0_4_
                                                                        ,(secp256k1_xonly_pubkey *)
                                                                         &pk,xy_sk);
                                                    psVar10 = CTX;
                                                    if (iVar11 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           __calls_to_callback_3;
                                                      (psVar10->illegal_callback).data = pvStack_e20
                                                      ;
                                                      if (ones32._0_4_ == 1) {
                                                        iVar11 = 
                                                  secp256k1_xonly_pubkey_tweak_add_check
                                                            (psVar10,sk,2,
                                                             (secp256k1_xonly_pubkey *)&pk,xy_sk);
                                                  if (iVar11 != 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, 2, &internal_xonly_pk, tweak) == 0"
                                                  ;
                                                  uStack_e40 = 0xe1;
                                                  goto LAB_00125c9b;
                                                  }
                                                  ones32[0] = '\0';
                                                  ones32[1] = '\0';
                                                  ones32[2] = '\0';
                                                  ones32[3] = '\0';
                                                  __calls_to_callback_3 = (CTX->illegal_callback).fn
                                                  ;
                                                  pvStack_e20 = (CTX->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,ones32);
                                                  iVar11 = secp256k1_xonly_pubkey_tweak_add_check
                                                                     (CTX,sk,buf32._0_4_,
                                                                      (secp256k1_xonly_pubkey *)0x0,
                                                                      xy_sk);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         __calls_to_callback_3;
                                                    (psVar10->illegal_callback).data = pvStack_e20;
                                                    if (ones32._0_4_ == 1) {
                                                      ones32[0] = '\0';
                                                      ones32[1] = '\0';
                                                      ones32[2] = '\0';
                                                      ones32[3] = '\0';
                                                      __calls_to_callback_3 =
                                                           (psVar10->illegal_callback).fn;
                                                      pvStack_e20 = (psVar10->illegal_callback).data
                                                      ;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar10,counting_callback_fn,ones32
                                                                );
                                                      iVar11 = 
                                                  secp256k1_xonly_pubkey_tweak_add_check
                                                            (CTX,sk,buf32._0_4_,
                                                             (secp256k1_xonly_pubkey *)&pk,
                                                             (uchar *)0x0);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         __calls_to_callback_3;
                                                    (psVar10->illegal_callback).data = pvStack_e20;
                                                    if (ones32._0_4_ == 1) {
                                                      builtin_memcpy(xy_sk,
                                                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                                  ,0x20);
                                                  pubkey = &pk2;
                                                  iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                                     (psVar10,(
                                                  secp256k1_xonly_pubkey *)&pk,(int *)0x0,
                                                  (secp256k1_pubkey *)pubkey);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &internal_xonly_pk, NULL, &internal_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0xe6;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0xe7;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,
                                                                        (secp256k1_pubkey *)
                                                                        &xonly_pk);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &output_xonly_pk, &pk_parity, &output_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0xe8;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,(uchar *)&
                                                  _calls_to_callback_3,&xonly_pk_tmp);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, output_pk32, &output_xonly_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0xe9;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,(uchar *)&
                                                  _calls_to_callback_3,buf32._0_4_,
                                                  (secp256k1_xonly_pubkey *)&pk,xy_sk);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0xea;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,(uchar *)&
                                                  _calls_to_callback_3,(uint)(buf32._0_4_ == 0),
                                                  (secp256k1_xonly_pubkey *)&pk,xy_sk);
                                                  if (iVar11 == 0) {
                                                    iVar11 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,sk,(
                                                  secp256k1_xonly_pubkey *)&pk);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, buf32, &internal_xonly_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0xef;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,sk,buf32._0_4_,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,xy_sk);
                                                    if (iVar11 == 0) {
                                                      iVar11 = 
                                                  secp256k1_xonly_pubkey_tweak_add_check
                                                            (CTX,(uchar *)&_calls_to_callback_3,
                                                             buf32._0_4_,
                                                             (secp256k1_xonly_pubkey *)&pk,zeros64);
                                                  if (iVar11 == 0) {
                                                    iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk,zeros64);
                                                    if (iVar11 == 0) {
                                                      iVar11 = secp256k1_memcmp_var
                                                                         (&xonly_pk,&pk1,0x40);
                                                      if (iVar11 == 0) {
                                                        testrand256(xonly_pk.data);
                                                        pubkey_01 = &pk1;
                                                        iVar11 = secp256k1_ec_pubkey_create
                                                                           (CTX,(secp256k1_pubkey *)
                                                                                pubkey_01,
                                                                            xonly_pk.data);
                                                        if (iVar11 == 0) {
                                                          pcVar13 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk[0], sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x104;
                                                  }
                                                  else {
                                                    for (lVar14 = -0x1f; lVar14 != 0;
                                                        lVar14 = lVar14 + 1) {
                                                      cVar15 = (char)lVar14 + ' ';
                                                      auVar17 = ZEXT216(CONCAT11(cVar15,cVar15));
                                                      auVar17 = pshuflw(auVar17,auVar17,0);
                                                      uVar16 = auVar17._0_4_;
                                                      *(undefined4 *)((pubkey->x).n + 2) = uVar16;
                                                      *(undefined4 *)((long)(pubkey->x).n + 0x14) =
                                                           uVar16;
                                                      *(undefined4 *)((pubkey->x).n + 3) = uVar16;
                                                      *(undefined4 *)((long)(pubkey->x).n + 0x1c) =
                                                           uVar16;
                                                      *(undefined4 *)(pubkey->x).n = uVar16;
                                                      *(undefined4 *)((long)(pubkey->x).n + 4) =
                                                           uVar16;
                                                      *(undefined4 *)((pubkey->x).n + 1) = uVar16;
                                                      *(undefined4 *)((long)(pubkey->x).n + 0xc) =
                                                           uVar16;
                                                      iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                                         (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk,(int *)0x0,
                                                  (secp256k1_pubkey *)pubkey_01);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk[i]) == 1"
                                                  ;
                                                  uStack_e40 = 0x109;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pubkey_01 = (secp256k1_ge *)((pubkey_01->y).n + 2)
                                                  ;
                                                  iVar11 = secp256k1_xonly_pubkey_tweak_add
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          pubkey_01,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      (uchar *)pubkey);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &pk[i + 1], &xonly_pk, tweak[i]) == 1"
                                                  ;
                                                  uStack_e40 = 0x10a;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pubkey = (secp256k1_ge *)((pubkey->x).n + 4);
                                                  }
                                                  pubkey_00 = local_b8;
                                                  for (lVar14 = 0x3c0; lVar14 != -0x20;
                                                      lVar14 = lVar14 + -0x20) {
                                                    iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk,(int *)zeros64,
                                                                        pubkey_00 + 1);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk[i]) == 1"
                                                  ;
                                                  uStack_e40 = 0x111;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar11 = secp256k1_xonly_pubkey_serialize
                                                                     (CTX,xonly_pk_tmp.data,
                                                                      (secp256k1_xonly_pubkey *)&pk)
                                                  ;
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, pk_serialized, &xonly_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0x112;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                                     (CTX,(secp256k1_xonly_pubkey *)
                                                                          &pk,(int *)0x0,pubkey_00);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk[i - 1]) == 1"
                                                  ;
                                                  uStack_e40 = 0x113;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar11 = secp256k1_xonly_pubkey_tweak_add_check
                                                                     (CTX,xonly_pk_tmp.data,
                                                                      zeros64._0_4_,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      (uchar *)((long)pk2.x.n +
                                                                               lVar14));
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, pk_serialized, pk_parity, &xonly_pk, tweak[i - 1]) == 1"
                                                  ;
                                                  uStack_e40 = 0x114;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pubkey_00 = pubkey_00 + -1;
                                                  }
                                                  pk.data[0x18] = 0x80;
                                                  pk.data[0x19] = '&';
                                                  pk.data[0x1a] = '\x11';
                                                  pk.data[0x1b] = 0xef;
                                                  pk.data[0x1c] = 'g';
                                                  pk.data[0x1d] = 'K';
                                                  pk.data[0x1e] = 0xd9;
                                                  pk.data[0x1f] = '#';
                                                  pk.data[0x10] = 0xd0;
                                                  pk.data[0x11] = 0x9a;
                                                  pk.data[0x12] = 0xa1;
                                                  pk.data[0x13] = '\x1b';
                                                  pk.data[0x14] = 0x80;
                                                  pk.data[0x15] = '\v';
                                                  pk.data[0x16] = '^';
                                                  pk.data[0x17] = 0x93;
                                                  pk.data[8] = 0x92;
                                                  pk.data[9] = '8';
                                                  pk.data[10] = 0xa6;
                                                  pk.data[0xb] = '&';
                                                  pk.data[0xc] = 'b';
                                                  pk.data[0xd] = 'R';
                                                  pk.data[0xe] = '5';
                                                  pk.data[0xf] = '\x11';
                                                  pk.data[0] = 'X';
                                                  pk.data[1] = 0x84;
                                                  pk.data[2] = 0xb3;
                                                  pk.data[3] = 0xa2;
                                                  pk.data[4] = 'K';
                                                  pk.data[5] = 0x97;
                                                  pk.data[6] = '7';
                                                  pk.data[7] = 0x88;
                                                  xonly_pk.data[0x10] = 0xb2;
                                                  xonly_pk.data[0x11] = 0xc2;
                                                  xonly_pk.data[0x12] = 0xd5;
                                                  xonly_pk.data[0x13] = '\x03';
                                                  xonly_pk.data[0x14] = 0xa7;
                                                  xonly_pk.data[0x15] = 0xf9;
                                                  xonly_pk.data[0x16] = 0xf1;
                                                  xonly_pk.data[0x17] = 'O';
                                                  xonly_pk.data[0x18] = 0xa8;
                                                  xonly_pk.data[0x19] = 0xfa;
                                                  xonly_pk.data[0x1a] = 0x95;
                                                  xonly_pk.data[0x1b] = 0xa8;
                                                  xonly_pk.data[0x1c] = 0xe9;
                                                  xonly_pk.data[0x1d] = 'i';
                                                  xonly_pk.data[0x1e] = 'v';
                                                  xonly_pk.data[0x1f] = '\x1c';
                                                  xonly_pk.data[0] = 0xde;
                                                  xonly_pk.data[1] = '6';
                                                  xonly_pk.data[2] = '\x0e';
                                                  xonly_pk.data[3] = 0x87;
                                                  xonly_pk.data[4] = 'Y';
                                                  xonly_pk.data[5] = 0x8f;
                                                  xonly_pk.data[6] = '<';
                                                  xonly_pk.data[7] = '\x01';
                                                  xonly_pk.data[8] = '6';
                                                  xonly_pk.data[9] = '*';
                                                  xonly_pk.data[10] = '*';
                                                  xonly_pk.data[0xb] = 0xb8;
                                                  xonly_pk.data[0xc] = 0xc6;
                                                  xonly_pk.data[0xd] = 0xf4;
                                                  xonly_pk.data[0xe] = '^';
                                                  xonly_pk.data[0xf] = 'M';
                                                  iVar11 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,(secp256k1_xonly_pubkey *)
                                                                          &pk1,pk.data);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk1, pk1_ser) == 1"
                                                  ;
                                                  uStack_e40 = 0x7a;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_parse
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk2,xonly_pk.data);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk2, pk2_ser) == 1"
                                                  ;
                                                  uStack_e40 = 0x7b;
                                                  }
                                                  else {
                                                    auVar3._12_4_ = 0;
                                                    auVar3[0] = zeros64[4];
                                                    auVar3[1] = zeros64[5];
                                                    auVar3[2] = zeros64[6];
                                                    auVar3[3] = zeros64[7];
                                                    auVar3[4] = zeros64[8];
                                                    auVar3[5] = zeros64[9];
                                                    auVar3[6] = zeros64[10];
                                                    auVar3[7] = zeros64[0xb];
                                                    auVar3[8] = zeros64[0xc];
                                                    auVar3[9] = zeros64[0xd];
                                                    auVar3[10] = zeros64[0xe];
                                                    auVar3[0xb] = zeros64[0xf];
                                                    zeros64._0_16_ = auVar3 << 0x20;
                                                    xonly_pk_tmp.data._0_16_ = CTX->illegal_callback
                                                    ;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,zeros64);
                                                    iVar11 = secp256k1_xonly_pubkey_cmp
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)0x0,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk2);
                                                    psVar10 = CTX;
                                                    if (iVar11 < 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           xonly_pk_tmp.data._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)xonly_pk_tmp.data._8_8_;
                                                      if (zeros64._0_4_ == 1) {
                                                        auVar4._12_4_ = 0;
                                                        auVar4[0] = zeros64[4];
                                                        auVar4[1] = zeros64[5];
                                                        auVar4[2] = zeros64[6];
                                                        auVar4[3] = zeros64[7];
                                                        auVar4[4] = zeros64[8];
                                                        auVar4[5] = zeros64[9];
                                                        auVar4[6] = zeros64[10];
                                                        auVar4[7] = zeros64[0xb];
                                                        auVar4[8] = zeros64[0xc];
                                                        auVar4[9] = zeros64[0xd];
                                                        auVar4[10] = zeros64[0xe];
                                                        auVar4[0xb] = zeros64[0xf];
                                                        zeros64._0_16_ = auVar4 << 0x20;
                                                        xonly_pk_tmp.data._0_16_ =
                                                             psVar10->illegal_callback;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar10,counting_callback_fn,
                                                                   zeros64);
                                                        iVar11 = secp256k1_xonly_pubkey_cmp
                                                                           (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk1,
                                                  (secp256k1_xonly_pubkey *)0x0);
                                                  psVar10 = CTX;
                                                  if (iVar11 < 1) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, NULL) > 0"
                                                  ;
                                                  }
                                                  else {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         xonly_pk_tmp.data._0_8_;
                                                    (psVar10->illegal_callback).data =
                                                         (void *)xonly_pk_tmp.data._8_8_;
                                                    if (zeros64._0_4_ == 1) {
                                                      iVar11 = secp256k1_xonly_pubkey_cmp
                                                                         (psVar10,(
                                                  secp256k1_xonly_pubkey *)&pk1,
                                                  (secp256k1_xonly_pubkey *)&pk2);
                                                  if (iVar11 < 0) {
                                                    iVar11 = secp256k1_xonly_pubkey_cmp
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk2,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk1);
                                                    if (iVar11 < 1) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0"
                                                  ;
                                                  uStack_e40 = 0x80;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_cmp
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk1,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk1);
                                                    if (iVar11 == 0) {
                                                      iVar11 = secp256k1_xonly_pubkey_cmp
                                                                         (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk2,
                                                  (secp256k1_xonly_pubkey *)&pk2);
                                                  if (iVar11 == 0) {
                                                    pk1.y.n._0_16_ = ZEXT816(0);
                                                    pk1.x._32_16_ = ZEXT816(0);
                                                    pk1.x.n._16_16_ = ZEXT816(0);
                                                    auVar5._12_4_ = 0;
                                                    auVar5[0] = zeros64[4];
                                                    auVar5[1] = zeros64[5];
                                                    auVar5[2] = zeros64[6];
                                                    auVar5[3] = zeros64[7];
                                                    auVar5[4] = zeros64[8];
                                                    auVar5[5] = zeros64[9];
                                                    auVar5[6] = zeros64[10];
                                                    auVar5[7] = zeros64[0xb];
                                                    auVar5[8] = zeros64[0xc];
                                                    auVar5[9] = zeros64[0xd];
                                                    auVar5[10] = zeros64[0xe];
                                                    auVar5[0xb] = zeros64[0xf];
                                                    zeros64._0_16_ = auVar5 << 0x20;
                                                    pk1.x.n._0_16_ = ZEXT816(0);
                                                    xonly_pk_tmp.data._0_16_ = CTX->illegal_callback
                                                    ;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,zeros64);
                                                    iVar11 = secp256k1_xonly_pubkey_cmp
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&pk1,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &pk2);
                                                    psVar10 = CTX;
                                                    if (iVar11 < 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           xonly_pk_tmp.data._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)xonly_pk_tmp.data._8_8_;
                                                      if (zeros64._0_4_ == 1) {
                                                        auVar6._12_4_ = 0;
                                                        auVar6[0] = xonly_pk_tmp.data[4];
                                                        auVar6[1] = xonly_pk_tmp.data[5];
                                                        auVar6[2] = xonly_pk_tmp.data[6];
                                                        auVar6[3] = xonly_pk_tmp.data[7];
                                                        auVar6[4] = xonly_pk_tmp.data[8];
                                                        auVar6[5] = xonly_pk_tmp.data[9];
                                                        auVar6[6] = xonly_pk_tmp.data[10];
                                                        auVar6[7] = xonly_pk_tmp.data[0xb];
                                                        auVar6[8] = xonly_pk_tmp.data[0xc];
                                                        auVar6[9] = xonly_pk_tmp.data[0xd];
                                                        auVar6[10] = xonly_pk_tmp.data[0xe];
                                                        auVar6[0xb] = xonly_pk_tmp.data[0xf];
                                                        xonly_pk_tmp.data._0_16_ = auVar6 << 0x20;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar10,counting_callback_fn,
                                                                   &xonly_pk_tmp);
                                                        iVar11 = secp256k1_xonly_pubkey_cmp
                                                                           (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk1,
                                                  (secp256k1_xonly_pubkey *)&pk1);
                                                  if (iVar11 == 0) {
                                                    if (xonly_pk_tmp.data._0_4_ == 2) {
                                                      secp256k1_context_set_illegal_callback
                                                                (CTX,(_func_void_char_ptr_void_ptr *
                                                                     )0x0,(void *)0x0);
                                                      auVar7._12_4_ = 0;
                                                      auVar7[0] = zeros64[4];
                                                      auVar7[1] = zeros64[5];
                                                      auVar7[2] = zeros64[6];
                                                      auVar7[3] = zeros64[7];
                                                      auVar7[4] = zeros64[8];
                                                      auVar7[5] = zeros64[9];
                                                      auVar7[6] = zeros64[10];
                                                      auVar7[7] = zeros64[0xb];
                                                      auVar7[8] = zeros64[0xc];
                                                      auVar7[9] = zeros64[0xd];
                                                      auVar7[10] = zeros64[0xe];
                                                      auVar7[0xb] = zeros64[0xf];
                                                      zeros64._0_16_ = auVar7 << 0x20;
                                                      xonly_pk_tmp.data._0_16_ =
                                                           CTX->illegal_callback;
                                                      secp256k1_context_set_illegal_callback
                                                                (CTX,counting_callback_fn,zeros64);
                                                      iVar11 = secp256k1_xonly_pubkey_cmp
                                                                         (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk2,
                                                  (secp256k1_xonly_pubkey *)&pk1);
                                                  psVar10 = CTX;
                                                  if (iVar11 < 1) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0"
                                                  ;
                                                  }
                                                  else {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         xonly_pk_tmp.data._0_8_;
                                                    (psVar10->illegal_callback).data =
                                                         (void *)xonly_pk_tmp.data._8_8_;
                                                    if (zeros64._0_4_ == 1) {
                                                      pk1.y.n[4] = 0;
                                                      pk1.y.magnitude = 0;
                                                      pk1.y.normalized = 0;
                                                      pk1.y.n[2] = 0;
                                                      pk1.y.n[3] = 0;
                                                      pk1.y.n[0] = 0;
                                                      pk1.y.n[1] = 0;
                                                      pk1.x.n[4] = 0;
                                                      pk1.x.magnitude = 0;
                                                      pk1.x.normalized = 0;
                                                      pk1.x.n[2] = 0;
                                                      pk1.x.n[3] = 0;
                                                      pk1.x.n[0] = 0;
                                                      pk1.x.n[1] = 0;
                                                      sk[8] = 0xff;
                                                      sk[9] = 0xff;
                                                      sk[10] = 0xff;
                                                      sk[0xb] = 0xff;
                                                      sk[0] = 0xff;
                                                      sk[1] = 0xff;
                                                      sk[2] = 0xff;
                                                      sk[3] = 0xff;
                                                      sk[4] = 0xff;
                                                      sk[5] = 0xff;
                                                      sk[6] = 0xff;
                                                      sk[7] = 0xff;
                                                      sk[0xc] = 0xff;
                                                      sk[0xd] = 0xff;
                                                      sk[0xe] = 0xff;
                                                      sk[0xf] = 0xff;
                                                      sk[0x18] = 0xff;
                                                      sk[0x19] = 0xff;
                                                      sk[0x1a] = 0xff;
                                                      sk[0x1b] = 0xff;
                                                      sk[0x10] = 0xff;
                                                      sk[0x11] = 0xff;
                                                      sk[0x12] = 0xff;
                                                      sk[0x13] = 0xff;
                                                      sk[0x14] = 0xff;
                                                      sk[0x15] = 0xff;
                                                      sk[0x16] = 0xff;
                                                      sk[0x17] = 0xff;
                                                      sk[0x1c] = 0xff;
                                                      sk[0x1d] = 0xff;
                                                      sk[0x1e] = 0xff;
                                                      sk[0x1f] = 0xff;
                                                      testrand256((uchar *)&y);
                                                      iVar11 = secp256k1_keypair_create
                                                                         (psVar10,(secp256k1_keypair
                                                                                   *)&pk2,
                                                                          (uchar *)&y);
                                                      if (iVar11 == 0) {
                                                        pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x128;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) != 0"
                                                  ;
                                                  uStack_e40 = 0x129;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_create
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk2,(uchar *)&y);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x12a;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) != 0"
                                                  ;
                                                  uStack_e40 = 299;
                                                  }
                                                  else {
                                                    xonly_pk.data._0_8_ =
                                                         xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                    pk.data._0_16_ = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&xonly_pk);
                                                    iVar11 = secp256k1_keypair_create
                                                                       (CTX,(secp256k1_keypair *)0x0
                                                                        ,(uchar *)&y);
                                                    psVar10 = CTX;
                                                    if (iVar11 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           pk.data._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)pk.data._8_8_;
                                                      if (xonly_pk.data._0_4_ == 1) {
                                                        xonly_pk.data._0_8_ =
                                                             xonly_pk.data._0_8_ &
                                                             0xffffffff00000000;
                                                        pk.data._0_16_ = psVar10->illegal_callback;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar10,counting_callback_fn,
                                                                   &xonly_pk);
                                                        iVar11 = secp256k1_keypair_create
                                                                           (CTX,(secp256k1_keypair *
                                                                                )&pk2,(uchar *)0x0);
                                                        psVar10 = CTX;
                                                        if (iVar11 == 0) {
                                                          (CTX->illegal_callback).fn =
                                                               (_func_void_char_ptr_void_ptr *)
                                                               pk.data._0_8_;
                                                          (psVar10->illegal_callback).data =
                                                               (void *)pk.data._8_8_;
                                                          if (xonly_pk.data._0_4_ == 1) {
                                                            iVar11 = secp256k1_memcmp_var
                                                                               (&pk1,&pk2,0x60);
                                                            if (iVar11 == 0) {
                                                              iVar11 = secp256k1_keypair_create
                                                                                 (psVar10,(
                                                  secp256k1_keypair *)&pk2,(uchar *)&y);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x12f;
                                                  }
                                                  else {
                                                    xonly_pk.data._0_8_ =
                                                         xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                    pk.data._0_16_ = STATIC_CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (STATIC_CTX,counting_callback_fn,
                                                               &xonly_pk);
                                                    iVar11 = secp256k1_keypair_create
                                                                       (STATIC_CTX,
                                                                        (secp256k1_keypair *)&pk2,
                                                                        (uchar *)&y);
                                                    psVar10 = STATIC_CTX;
                                                    if (iVar11 == 0) {
                                                      (STATIC_CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           pk.data._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)pk.data._8_8_;
                                                      if (xonly_pk.data._0_4_ == 1) {
                                                        iVar11 = secp256k1_memcmp_var
                                                                           (&pk1,&pk2,0x60);
                                                        if (iVar11 == 0) {
                                                          iVar11 = secp256k1_keypair_create
                                                                             (CTX,(secp256k1_keypair
                                                                                   *)&pk2,
                                                                              (uchar *)&pk1);
                                                          if (iVar11 == 0) {
                                                            iVar11 = secp256k1_memcmp_var
                                                                               (&pk1,&pk2,0x60);
                                                            if (iVar11 == 0) {
                                                              iVar11 = secp256k1_keypair_create
                                                                                 (CTX,(
                                                  secp256k1_keypair *)&pk2,sk);
                                                  if (iVar11 == 0) {
                                                    iVar11 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                    if (iVar11 == 0) {
                                                      testrand256((uchar *)&y);
                                                      iVar11 = secp256k1_keypair_create
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk2,(uchar *)&y);
                                                      if (iVar11 == 0) {
                                                        pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x13b;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_pub
                                                                       (CTX,&pk,(secp256k1_keypair *
                                                                                )&pk2);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_pub(CTX, &pk, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x13c;
                                                  }
                                                  else {
                                                    auVar8._12_4_ = 0;
                                                    auVar8[0] = xonly_pk_tmp.data[4];
                                                    auVar8[1] = xonly_pk_tmp.data[5];
                                                    auVar8[2] = xonly_pk_tmp.data[6];
                                                    auVar8[3] = xonly_pk_tmp.data[7];
                                                    auVar8[4] = xonly_pk_tmp.data[8];
                                                    auVar8[5] = xonly_pk_tmp.data[9];
                                                    auVar8[6] = xonly_pk_tmp.data[10];
                                                    auVar8[7] = xonly_pk_tmp.data[0xb];
                                                    auVar8[8] = xonly_pk_tmp.data[0xc];
                                                    auVar8[9] = xonly_pk_tmp.data[0xd];
                                                    auVar8[10] = xonly_pk_tmp.data[0xe];
                                                    auVar8[0xb] = xonly_pk_tmp.data[0xf];
                                                    xonly_pk_tmp.data._0_16_ = auVar8 << 0x20;
                                                    xonly_pk.data._0_8_ = (CTX->illegal_callback).fn
                                                    ;
                                                    xonly_pk.data._8_8_ =
                                                         (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &xonly_pk_tmp);
                                                    iVar11 = secp256k1_keypair_pub
                                                                       (CTX,(secp256k1_pubkey *)0x0,
                                                                        (secp256k1_keypair *)&pk2);
                                                    psVar10 = CTX;
                                                    if (iVar11 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           xonly_pk.data._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)xonly_pk.data._8_8_;
                                                      if (xonly_pk_tmp.data._0_4_ == 1) {
                                                        auVar9._12_4_ = 0;
                                                        auVar9[0] = xonly_pk_tmp.data[4];
                                                        auVar9[1] = xonly_pk_tmp.data[5];
                                                        auVar9[2] = xonly_pk_tmp.data[6];
                                                        auVar9[3] = xonly_pk_tmp.data[7];
                                                        auVar9[4] = xonly_pk_tmp.data[8];
                                                        auVar9[5] = xonly_pk_tmp.data[9];
                                                        auVar9[6] = xonly_pk_tmp.data[10];
                                                        auVar9[7] = xonly_pk_tmp.data[0xb];
                                                        auVar9[8] = xonly_pk_tmp.data[0xc];
                                                        auVar9[9] = xonly_pk_tmp.data[0xd];
                                                        auVar9[10] = xonly_pk_tmp.data[0xe];
                                                        auVar9[0xb] = xonly_pk_tmp.data[0xf];
                                                        xonly_pk_tmp.data._0_16_ = auVar9 << 0x20;
                                                        xonly_pk.data._0_8_ =
                                                             (psVar10->illegal_callback).fn;
                                                        xonly_pk.data._8_8_ =
                                                             (psVar10->illegal_callback).data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar10,counting_callback_fn,
                                                                   &xonly_pk_tmp);
                                                        iVar11 = secp256k1_keypair_pub
                                                                           (CTX,&pk,(
                                                  secp256k1_keypair *)0x0);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         xonly_pk.data._0_8_;
                                                    (psVar10->illegal_callback).data =
                                                         (void *)xonly_pk.data._8_8_;
                                                    if (xonly_pk_tmp.data._0_4_ == 1) {
                                                      iVar11 = secp256k1_memcmp_var(&pk1,&pk,0x40);
                                                      if (iVar11 == 0) {
                                                        pk2.y._32_16_ = ZEXT816(0);
                                                        pk2.y.n._16_16_ = ZEXT816(0);
                                                        pk2.y.n._0_16_ = ZEXT816(0);
                                                        pk2.x.n._16_16_ = ZEXT816(0);
                                                        pk2.x.n._0_16_ = ZEXT816(0);
                                                        pk2.x._32_16_ = ZEXT816(0);
                                                        pk.data._0_16_ = ZEXT816(0);
                                                        pk.data._16_16_ = ZEXT816(0);
                                                        pk.data._32_16_ = ZEXT816(0);
                                                        pk.data._48_16_ = ZEXT816(0);
                                                        iVar11 = secp256k1_memcmp_var(&pk1,&pk,0x40)
                                                        ;
                                                        if (iVar11 == 0) {
                                                          iVar11 = secp256k1_ec_pubkey_create
                                                                             (psVar10,&pk,
                                                                              (uchar *)&y);
                                                          if (iVar11 == 0) {
                                                            pcVar13 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x147;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_create
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk2,(uchar *)&y);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x148;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_pub
                                                                       (CTX,(secp256k1_pubkey *)
                                                                            &xonly_pk,
                                                                        (secp256k1_keypair *)&pk2);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_pub(CTX, &pk_tmp, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x149;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_memcmp_var
                                                                       (&pk,&xonly_pk,0x40);
                                                    if (iVar11 == 0) {
                                                      testrand256((uchar *)&y);
                                                      iVar11 = secp256k1_keypair_create
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk2,(uchar *)&y);
                                                      if (iVar11 == 0) {
                                                        pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x14e;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_xonly_pub
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,
                                                                        (secp256k1_keypair *)&pk2);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x14f;
                                                  }
                                                  else {
                                                    __calls_to_callback_3 =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         ((ulong)__calls_to_callback_3 &
                                                         0xffffffff00000000);
                                                    zeros64._0_16_ =
                                                         *(undefined1 (*) [16])
                                                          &CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &_calls_to_callback_3);
                                                    iVar11 = secp256k1_keypair_xonly_pub
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)0x0,(int *)buf32,
                                                                        (secp256k1_keypair *)&pk2);
                                                    psVar10 = CTX;
                                                    if (iVar11 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           zeros64._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)zeros64._8_8_;
                                                      if (_calls_to_callback_3 == 1) {
                                                        iVar11 = secp256k1_keypair_xonly_pub
                                                                           (psVar10,&xonly_pk_tmp,
                                                                            (int *)0x0,
                                                                            (secp256k1_keypair *)
                                                                            &pk2);
                                                        if (iVar11 == 0) {
                                                          pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, NULL, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x151;
                                                  goto LAB_00125c9b;
                                                  }
                                                  __calls_to_callback_3 =
                                                       (_func_void_char_ptr_void_ptr *)
                                                       ((ulong)__calls_to_callback_3 &
                                                       0xffffffff00000000);
                                                  zeros64._0_16_ =
                                                       *(undefined1 (*) [16])&CTX->illegal_callback;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,
                                                             &_calls_to_callback_3);
                                                  iVar11 = secp256k1_keypair_xonly_pub
                                                                     (CTX,&xonly_pk_tmp,(int *)buf32
                                                                      ,(secp256k1_keypair *)0x0);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         zeros64._0_8_;
                                                    (psVar10->illegal_callback).data =
                                                         (void *)zeros64._8_8_;
                                                    if (_calls_to_callback_3 == 1) {
                                                      iVar11 = secp256k1_memcmp_var
                                                                         (&pk1,&xonly_pk_tmp,0x40);
                                                      if (iVar11 == 0) {
                                                        iVar11 = secp256k1_keypair_xonly_pub
                                                                           (psVar10,&xonly_pk_tmp,
                                                                            (int *)buf32,
                                                                            (secp256k1_keypair *)
                                                                            &pk2);
                                                        if (iVar11 == 0) {
                                                          pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x156;
                                                  }
                                                  else {
                                                    pk2.y._32_16_ = ZEXT816(0);
                                                    pk2.y.n._16_16_ = ZEXT816(0);
                                                    pk2.y.n._0_16_ = ZEXT816(0);
                                                    pk2.x._32_16_ = ZEXT816(0);
                                                    pk2.x.n._16_16_ = ZEXT816(0);
                                                    __calls_to_callback_3 =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         ((ulong)__calls_to_callback_3 &
                                                         0xffffffff00000000);
                                                    pk2.x.n._0_16_ = ZEXT816(0);
                                                    zeros64._0_16_ =
                                                         *(undefined1 (*) [16])
                                                          &CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &_calls_to_callback_3);
                                                    iVar11 = secp256k1_keypair_xonly_pub
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,
                                                                        (secp256k1_keypair *)&pk2);
                                                    psVar10 = CTX;
                                                    if (iVar11 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           zeros64._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)zeros64._8_8_;
                                                      if (_calls_to_callback_3 == 1) {
                                                        iVar11 = secp256k1_memcmp_var
                                                                           (&pk1,&xonly_pk_tmp,0x40)
                                                        ;
                                                        if (iVar11 == 0) {
                                                          iVar11 = secp256k1_ec_pubkey_create
                                                                             (psVar10,&pk,
                                                                              (uchar *)&y);
                                                          if (iVar11 == 0) {
                                                            pcVar13 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x15c;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_xonly_pubkey_from_pubkey
                                                                       (CTX,&xonly_pk_tmp,
                                                                        (int *)buf32,&pk);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1"
                                                  ;
                                                  uStack_e40 = 0x15d;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_create
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk2,(uchar *)&y);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x15e;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_xonly_pub
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)zeros64,(int *)ones32
                                                                        ,(secp256k1_keypair *)&pk2);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &xonly_pk_tmp, &pk_parity_tmp, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x15f;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_memcmp_var
                                                                       (&xonly_pk_tmp,zeros64,0x40);
                                                    if (iVar11 == 0) {
                                                      if (buf32._0_4_ == ones32._0_4_) {
                                                        testrand256((uchar *)&y);
                                                        iVar11 = secp256k1_keypair_create
                                                                           (CTX,(secp256k1_keypair *
                                                                                )&pk2,(uchar *)&y);
                                                        if (iVar11 == 0) {
                                                          pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x165;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_sec
                                                                       (CTX,(uchar *)&
                                                  _calls_to_callback_3,(secp256k1_keypair *)&pk2);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_sec(CTX, sk_tmp, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x166;
                                                  }
                                                  else {
                                                    pk_parity = 0;
                                                    xy_sk._0_8_ = (CTX->illegal_callback).fn;
                                                    xy_sk._8_8_ = (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&pk_parity);
                                                    iVar11 = secp256k1_keypair_sec
                                                                       (CTX,(uchar *)0x0,
                                                                        (secp256k1_keypair *)&pk2);
                                                    psVar10 = CTX;
                                                    if (iVar11 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           xy_sk._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)xy_sk._8_8_;
                                                      if (pk_parity == 1) {
                                                        pk_parity = 0;
                                                        xy_sk._0_8_ = (psVar10->illegal_callback).fn
                                                        ;
                                                        xy_sk._8_8_ = (psVar10->illegal_callback).
                                                                      data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar10,counting_callback_fn,
                                                                   &pk_parity);
                                                        iVar11 = secp256k1_keypair_sec
                                                                           (CTX,(uchar *)&
                                                  _calls_to_callback_3,(secp256k1_keypair *)0x0);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)xy_sk._0_8_
                                                    ;
                                                    (psVar10->illegal_callback).data =
                                                         (void *)xy_sk._8_8_;
                                                    if (pk_parity == 1) {
                                                      iVar11 = secp256k1_memcmp_var
                                                                         (&pk1,&_calls_to_callback_3
                                                                          ,0x20);
                                                      if (iVar11 == 0) {
                                                        iVar11 = secp256k1_keypair_create
                                                                           (psVar10,(
                                                  secp256k1_keypair *)&pk2,(uchar *)&y);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x16c;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_sec
                                                                       (CTX,(uchar *)&
                                                  _calls_to_callback_3,(secp256k1_keypair *)&pk2);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_sec(CTX, sk_tmp, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x16d;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_memcmp_var
                                                                       (&y,&_calls_to_callback_3,
                                                                        0x20);
                                                    if (iVar11 == 0) {
                                                      pk2.y.n[4] = 0;
                                                      pk2.y.magnitude = 0;
                                                      pk2.y.normalized = 0;
                                                      pk2.y.n[2] = 0;
                                                      pk2.y.n[3] = 0;
                                                      pk2.y.n[0] = 0;
                                                      pk2.y.n[1] = 0;
                                                      pk2.x.n[4] = 0;
                                                      pk2.x.magnitude = 0;
                                                      pk2.x.normalized = 0;
                                                      pk2.x.n[2] = 0;
                                                      pk2.x.n[3] = 0;
                                                      pk2.x.n[0] = 0;
                                                      pk2.x.n[1] = 0;
                                                      iVar11 = secp256k1_keypair_sec
                                                                         (CTX,(uchar *)&
                                                  _calls_to_callback_3,(secp256k1_keypair *)&pk2);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_sec(CTX, sk_tmp, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x173;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_memcmp_var
                                                                       (&pk1,&_calls_to_callback_3,
                                                                        0x20);
                                                    if (iVar11 == 0) {
                                                      pk2.y.n[4] = 0;
                                                      pk2.y.magnitude = 0;
                                                      pk2.y.normalized = 0;
                                                      pk2.y.n[2] = 0;
                                                      pk2.y.n[3] = 0;
                                                      pk2.y.n[0] = 0;
                                                      pk2.y.n[1] = 0;
                                                      pk2.x.n[4] = 0;
                                                      pk2.x.magnitude = 0;
                                                      pk2.x.normalized = 0;
                                                      pk2.x.n[2] = 0;
                                                      pk2.x.n[3] = 0;
                                                      pk2.x.n[0] = 0;
                                                      pk2.x.n[1] = 0;
                                                      testrand256((uchar *)&y);
                                                      testrand256(sk);
                                                      local_e18 = 0xffffffff;
                                                      uStack_e14 = 0xffffffff;
                                                      uStack_e10 = 0xffffffff;
                                                      uStack_e0c = 0xffffffff;
                                                      __calls_to_callback_3 =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           0xffffffffffffffff;
                                                      pvStack_e20 = (void *)0xffffffffffffffff;
                                                      iVar11 = secp256k1_keypair_create
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk1,(uchar *)&y);
                                                      if (iVar11 == 0) {
                                                        pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x183;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,sk);
                                                    if (iVar11 == 1) {
                                                      iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk1,sk);
                                                      if (iVar11 == 1) {
                                                        iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                           (CTX,(secp256k1_keypair *
                                                                                )&pk1,sk);
                                                        if (iVar11 == 1) {
                                                          xonly_pk.data._0_8_ =
                                                               xonly_pk.data._0_8_ &
                                                               0xffffffff00000000;
                                                          pk.data._0_16_ = CTX->illegal_callback;
                                                          secp256k1_context_set_illegal_callback
                                                                    (CTX,counting_callback_fn,
                                                                     &xonly_pk);
                                                          iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                             (CTX,(secp256k1_keypair
                                                                                   *)0x0,sk);
                                                          psVar10 = CTX;
                                                          if (iVar11 == 0) {
                                                            (CTX->illegal_callback).fn =
                                                                 (_func_void_char_ptr_void_ptr *)
                                                                 pk.data._0_8_;
                                                            (psVar10->illegal_callback).data =
                                                                 (void *)pk.data._8_8_;
                                                            if (xonly_pk.data._0_4_ == 1) {
                                                              xonly_pk.data._0_8_ =
                                                                   xonly_pk.data._0_8_ &
                                                                   0xffffffff00000000;
                                                              pk.data._0_16_ =
                                                                   psVar10->illegal_callback;
                                                              secp256k1_context_set_illegal_callback
                                                                        (psVar10,
                                                  counting_callback_fn,&xonly_pk);
                                                  iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                     (CTX,(secp256k1_keypair *)&pk1,
                                                                      (uchar *)0x0);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         pk.data._0_8_;
                                                    (psVar10->illegal_callback).data =
                                                         (void *)pk.data._8_8_;
                                                    if (xonly_pk.data._0_4_ == 1) {
                                                      iVar11 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                      if (iVar11 == 0) {
                                                        pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) != 0"
                                                  ;
                                                  uStack_e40 = 0x18b;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_create
                                                                       (psVar10,(secp256k1_keypair *
                                                                                )&pk1,(uchar *)&y);
                                                    if (iVar11 == 0) {
                                                      pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x18e;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,(uchar *)&
                                                  _calls_to_callback_3);
                                                  if (iVar11 == 0) {
                                                    iVar11 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                    if (iVar11 == 0) {
                                                      iVar11 = secp256k1_keypair_create
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk1,(uchar *)&y);
                                                      if (iVar11 == 0) {
                                                        pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x193;
                                                  }
                                                  else {
                                                    iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,(uchar *)&pk2);
                                                    if (iVar11 == 1) {
                                                      for (iVar11 = 0; iVar11 < COUNT;
                                                          iVar11 = iVar11 + 1) {
                                                        testrand256((uchar *)&y);
                                                        iVar12 = secp256k1_keypair_create
                                                                           (CTX,(secp256k1_keypair *
                                                                                )&pk1,(uchar *)&y);
                                                        if (iVar12 == 0) {
                                                          pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x19b;
                                                  goto LAB_00125c9b;
                                                  }
                                                  memcpy((secp256k1_keypair *)&pk,&pk1,0x60);
                                                  secp256k1_scalar_set_b32
                                                            ((secp256k1_scalar *)&xonly_pk,
                                                             (uchar *)&y,(int *)0x0);
                                                  secp256k1_scalar_negate
                                                            ((secp256k1_scalar *)&xonly_pk,
                                                             (secp256k1_scalar *)&xonly_pk);
                                                  secp256k1_scalar_get_b32
                                                            (sk,(secp256k1_scalar *)&xonly_pk);
                                                  iVar12 = secp256k1_keypair_xonly_tweak_add
                                                                     (CTX,(secp256k1_keypair *)&pk1,
                                                                      (uchar *)&y);
                                                  if ((iVar12 != 0) &&
                                                     (iVar12 = secp256k1_keypair_xonly_tweak_add
                                                                         (CTX,(secp256k1_keypair *)
                                                                              &pk,sk), iVar12 != 0))
                                                  {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, sk) == 0) || (secp256k1_keypair_xonly_tweak_add(CTX, &keypair_tmp, tweak) == 0)"
                                                  ;
                                                  uStack_e40 = 0x1a3;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                  if ((iVar12 != 0) &&
                                                     (iVar12 = secp256k1_memcmp_var
                                                                         ((secp256k1_keypair *)&pk,
                                                                          &pk2,0x60), iVar12 != 0))
                                                  {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) == 0 || secp256k1_memcmp_var(&keypair_tmp, zeros96, sizeof(keypair_tmp)) == 0"
                                                  ;
                                                  uStack_e40 = 0x1a5;
                                                  goto LAB_00125c9b;
                                                  }
                                                  }
                                                  pk1.y.n[4] = 0;
                                                  pk1.y.magnitude = 0;
                                                  pk1.y.normalized = 0;
                                                  pk1.y.n[2] = 0;
                                                  pk1.y.n[3] = 0;
                                                  pk1.y.n[0] = 0;
                                                  pk1.y.n[1] = 0;
                                                  pk1.x.n[4] = 0;
                                                  pk1.x.magnitude = 0;
                                                  pk1.x.normalized = 0;
                                                  pk1.x.n[2] = 0;
                                                  pk1.x.n[3] = 0;
                                                  pk1.x.n[0] = 0;
                                                  pk1.x.n[1] = 0;
                                                  testrand256(sk);
                                                  xonly_pk.data._0_8_ =
                                                       xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                  pk.data._0_16_ = CTX->illegal_callback;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,&xonly_pk);
                                                  iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                     (CTX,(secp256k1_keypair *)&pk1,
                                                                      sk);
                                                  psVar10 = CTX;
                                                  if (iVar11 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)
                                                         pk.data._0_8_;
                                                    (psVar10->illegal_callback).data =
                                                         (void *)pk.data._8_8_;
                                                    if (xonly_pk.data._0_4_ == 1) {
                                                      iVar11 = secp256k1_memcmp_var(&pk1,&pk2,0x60);
                                                      if (iVar11 == 0) {
                                                        iVar11 = secp256k1_keypair_create
                                                                           (psVar10,(
                                                  secp256k1_keypair *)&pk1,(uchar *)&y);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x1ae;
                                                  }
                                                  else {
                                                    pk1.x.n._16_16_ = ZEXT816(0);
                                                    xonly_pk.data._0_8_ =
                                                         xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                    pk1.x.n._0_16_ = ZEXT816(0);
                                                    pk.data._0_16_ = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&xonly_pk);
                                                    iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,sk);
                                                    psVar10 = CTX;
                                                    if (iVar11 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           pk.data._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)pk.data._8_8_;
                                                      if (xonly_pk.data._0_4_ == 1) {
                                                        iVar11 = secp256k1_keypair_create
                                                                           (psVar10,(
                                                  secp256k1_keypair *)&pk1,(uchar *)&y);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x1b2;
                                                  }
                                                  else {
                                                    pk1.y._32_16_ = ZEXT816(0);
                                                    pk1.y.n._16_16_ = ZEXT816(0);
                                                    pk1.y.n._0_16_ = ZEXT816(0);
                                                    xonly_pk.data._0_8_ =
                                                         xonly_pk.data._0_8_ & 0xffffffff00000000;
                                                    pk1.x._32_16_ = ZEXT816(0);
                                                    pk.data._0_16_ = CTX->illegal_callback;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&xonly_pk);
                                                    iVar11 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &pk1,sk);
                                                    psVar10 = CTX;
                                                    if (iVar11 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           pk.data._0_8_;
                                                      (psVar10->illegal_callback).data =
                                                           (void *)pk.data._8_8_;
                                                      if (xonly_pk.data._0_4_ == 1) {
                                                        iVar11 = secp256k1_keypair_create
                                                                           (psVar10,(
                                                  secp256k1_keypair *)&pk1,(uchar *)&y);
                                                  if (iVar11 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uStack_e40 = 0x1b7;
                                                  }
                                                  else {
                                                    iVar11 = 0;
                                                    while( true ) {
                                                      if (COUNT <= iVar11) {
                                                        return;
                                                      }
                                                      testrand256(sk);
                                                      iVar12 = secp256k1_keypair_xonly_pub
                                                                         (CTX,(
                                                  secp256k1_xonly_pubkey *)&pk,(int *)0x0,
                                                  (secp256k1_keypair *)&pk1);
                                                  if (iVar12 == 0) break;
                                                  iVar12 = secp256k1_keypair_xonly_tweak_add
                                                                     (CTX,(secp256k1_keypair *)&pk1,
                                                                      sk);
                                                  if (iVar12 != 1) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0x1c3;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_keypair_xonly_pub
                                                                     (CTX,&xonly_pk,(int *)ones32,
                                                                      (secp256k1_keypair *)&pk1);
                                                  if (iVar12 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &output_pk, &pk_parity, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x1c4;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_xonly_pubkey_serialize
                                                                     (CTX,xy_sk,&xonly_pk);
                                                  if (iVar12 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, pk32, &output_pk) == 1"
                                                  ;
                                                  uStack_e40 = 0x1c7;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_xonly_pubkey_tweak_add_check
                                                                     (CTX,xy_sk,ones32._0_4_,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      sk);
                                                  if (iVar12 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, pk32, pk_parity, &internal_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0x1c8;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_keypair_pub
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          &xonly_pk_tmp,
                                                                      (secp256k1_keypair *)&pk1);
                                                  if (iVar12 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_pub(CTX, &output_pk_xy, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x1cb;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_xonly_pubkey_tweak_add
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          zeros64,
                                                                      (secp256k1_xonly_pubkey *)&pk,
                                                                      sk);
                                                  if (iVar12 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk_expected, &internal_pk, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0x1cc;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_memcmp_var
                                                                     ((secp256k1_pubkey *)
                                                                      &xonly_pk_tmp,
                                                                      (secp256k1_pubkey *)zeros64,
                                                                      0x40);
                                                  if (iVar12 != 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk_xy, &output_pk_expected, sizeof(output_pk_xy)) == 0"
                                                  ;
                                                  uStack_e40 = 0x1cd;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_keypair_sec
                                                                     (CTX,buf32,
                                                                      (secp256k1_keypair *)&pk1);
                                                  if (iVar12 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_sec(CTX, sk32, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x1d0;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_ec_pubkey_create
                                                                     (CTX,(secp256k1_pubkey *)
                                                                          zeros64,buf32);
                                                  if (iVar12 == 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &output_pk_expected, sk32) == 1"
                                                  ;
                                                  uStack_e40 = 0x1d1;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar12 = secp256k1_memcmp_var
                                                                     (&xonly_pk_tmp,
                                                                      (secp256k1_pubkey *)zeros64,
                                                                      0x40);
                                                  if (iVar12 != 0) {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk_xy, &output_pk_expected, sizeof(output_pk_xy)) == 0"
                                                  ;
                                                  uStack_e40 = 0x1d2;
                                                  goto LAB_00125c9b;
                                                  }
                                                  iVar11 = iVar11 + 1;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &internal_pk, NULL, &keypair) == 1"
                                                  ;
                                                  uStack_e40 = 0x1c2;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x1b4;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x1b0;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e40 = 0x1ac;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x1ab;
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, zeros96) == 1"
                                                  ;
                                                  uStack_e40 = 0x194;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e40 = 400;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, overflows) == 0"
                                                  ;
                                                  uStack_e40 = 399;
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x189;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, ((void*)0), tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x188;
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0x187;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0x186;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1"
                                                  ;
                                                  uStack_e40 = 0x185;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, sk_tmp, sizeof(sk_tmp)) == 0"
                                                  ;
                                                  uStack_e40 = 0x174;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(sk, sk_tmp, sizeof(sk_tmp)) == 0"
                                                  ;
                                                  uStack_e40 = 0x16e;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, sk_tmp, sizeof(sk_tmp)) == 0"
                                                  ;
                                                  uStack_e40 = 0x169;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_sec(CTX, sk_tmp, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x168;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_sec(CTX, ((void*)0), &keypair)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x167;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: pk_parity == pk_parity_tmp"
                                                  ;
                                                  uStack_e40 = 0x161;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x160;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &xonly_pk, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x159;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, &keypair)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x158;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &xonly_pk, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x153;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_pub(CTX, &xonly_pk, &pk_parity, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x152;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_xonly_pub(CTX, ((void*)0), &pk_parity, &keypair)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x150;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&pk, &pk_tmp, sizeof(pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x14a;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &pk, sizeof(pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x144;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &pk, sizeof(pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x13f;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_pub(CTX, &pk, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x13e;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_pub(CTX, ((void*)0), &keypair)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x13d;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e40 = 0x137;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, overflows) == 0"
                                                  ;
                                                  uStack_e40 = 0x136;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e40 = 0x135;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, zeros96) == 0"
                                                  ;
                                                  uStack_e40 = 0x134;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e40 = 0x131;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_create(STATIC_CTX, &keypair, sk)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x130;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(zeros96, &keypair, sizeof(keypair)) == 0"
                                                  ;
                                                  uStack_e40 = 0x12e;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_create(CTX, &keypair, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x12d;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_keypair_create(CTX, ((void*)0), sk)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 300;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  uStack_e40 = 0x8c;
                                                  }
                                                  else {
                                                    pcVar13 = "test condition failed: ecount == 2";
                                                    uStack_e40 = 0x89;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0"
                                                  ;
                                                  uStack_e40 = 0x88;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x84;
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk2) == 0"
                                                  ;
                                                  uStack_e40 = 0x82;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0"
                                                  ;
                                                  uStack_e40 = 0x81;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0"
                                                  ;
                                                  uStack_e40 = 0x7f;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  uStack_e40 = 0x7e;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_cmp(CTX, NULL, &pk2) < 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x7d;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0xf5;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, overflows) == 0"
                                                  ;
                                                  uStack_e40 = 0xf4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, pk_parity, &internal_xonly_pk, overflows) == 0"
                                                  ;
                                                  uStack_e40 = 0xf3;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, tweak) == 0"
                                                  ;
                                                  uStack_e40 = 0xf0;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk32, !pk_parity, &internal_xonly_pk, tweak) == 0"
                                                  ;
                                                  uStack_e40 = 0xed;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, &internal_xonly_pk, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0xe3;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add_check(CTX, buf32, pk_parity, ((void*)0), tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0xe2;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add_check(CTX, ((void*)0), pk_parity, &internal_xonly_pk, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0xdf;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0xc3;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0xc2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0xad;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, overflows) == 0"
                                                  ;
                                                  uStack_e40 = 0xac;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&output_pk, zeros64, sizeof(output_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0xa9;
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, &internal_xonly_pk, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0xa7;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk, ((void*)0), tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0xa4;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_tweak_add(CTX, ((void*)0), &internal_xonly_pk, tweak)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0xa3;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x5c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, zeros64) == 0"
                                                  ;
                                                  uStack_e40 = 0x5b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x58;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, ones32) == 0"
                                                  ;
                                                  uStack_e40 = 0x57;
                                                  }
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(xonly_pk)) == 0"
                                                  ;
                                                  uStack_e40 = 0x52;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x4c;
                                                  goto LAB_00125c9b;
                                                  }
                                                  pcVar13 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar13 = 
                                                  "test condition failed: (secp256k1_xonly_pubkey_parse(CTX, ((void*)0), buf32)) == 0"
                                                  ;
                                                  }
                                                  uStack_e40 = 0x4b;
                                                  goto LAB_00125c9b;
                                                }
                                                pcVar13 = 
                                                "test condition failed: _calls_to_callback == 1";
                                              }
                                              else {
                                                pcVar13 = 
                                                "test condition failed: (secp256k1_xonly_pubkey_serialize(CTX, buf32, &pk_tmp)) == 0"
                                                ;
                                              }
                                              uStack_e40 = 0x47;
                                              goto LAB_00125c9b;
                                            }
                                            pcVar13 = 
                                            "test condition failed: _calls_to_callback == 1";
                                          }
                                          else {
                                            pcVar13 = 
                                            "test condition failed: (secp256k1_xonly_pubkey_serialize(CTX, buf32, ((void*)0))) == 0"
                                            ;
                                          }
                                          uStack_e40 = 0x3f;
                                          goto LAB_00125c9b;
                                        }
                                        pcVar13 = "test condition failed: _calls_to_callback == 1";
                                      }
                                      else {
                                        pcVar13 = 
                                        "test condition failed: (secp256k1_xonly_pubkey_serialize(CTX, ((void*)0), &xonly_pk)) == 0"
                                        ;
                                      }
                                      uStack_e40 = 0x3e;
                                    }
                                  }
                                }
                                else {
                                  pcVar13 = "test condition failed: pk_parity == 1";
                                  uStack_e40 = 0x36;
                                }
                              }
                            }
                          }
                          else {
                            pcVar13 = "test condition failed: pk_parity == 0";
                            uStack_e40 = 0x2e;
                          }
                        }
                        else {
                          pcVar13 = 
                          "test condition failed: secp256k1_memcmp_var(&pk, &xonly_pk, sizeof(pk)) == 0"
                          ;
                          uStack_e40 = 0x2d;
                        }
                      }
                    }
                    goto LAB_00125c9b;
                  }
                  pcVar13 = "test condition failed: _calls_to_callback == 1";
                }
                else {
                  pcVar13 = 
                  "test condition failed: (secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk)) == 0"
                  ;
                }
                uStack_e40 = 0x26;
                goto LAB_00125c9b;
              }
              pcVar13 = "test condition failed: _calls_to_callback == 1";
            }
            else {
              pcVar13 = 
              "test condition failed: (secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, ((void*)0))) == 0"
              ;
            }
            uStack_e40 = 0x24;
            goto LAB_00125c9b;
          }
          pcVar13 = "test condition failed: _calls_to_callback == 1";
        }
        else {
          pcVar13 = 
          "test condition failed: (secp256k1_xonly_pubkey_from_pubkey(CTX, ((void*)0), &pk_parity, &pk)) == 0"
          ;
        }
        uStack_e40 = 0x22;
      }
    }
  }
LAB_00125c9b:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/extrakeys/tests_impl.h"
          ,uStack_e40,pcVar13);
  abort();
}

Assistant:

static void test_xonly_pubkey(void) {
    secp256k1_pubkey pk;
    secp256k1_xonly_pubkey xonly_pk, xonly_pk_tmp;
    secp256k1_ge pk1;
    secp256k1_ge pk2;
    secp256k1_fe y;
    unsigned char sk[32];
    unsigned char xy_sk[32];
    unsigned char buf32[32];
    unsigned char ones32[32];
    unsigned char zeros64[64] = { 0 };
    int pk_parity;
    int i;

    testrand256(sk);
    memset(ones32, 0xFF, 32);
    testrand256(xy_sk);
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);

    /* Test xonly_pubkey_from_pubkey */
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_from_pubkey(CTX, NULL, &pk_parity, &pk));
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, NULL));
    memset(&pk, 0, sizeof(pk));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk));

    /* Choose a secret key such that the resulting pubkey and xonly_pubkey match. */
    memset(sk, 0, sizeof(sk));
    sk[0] = 1;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_memcmp_var(&pk, &xonly_pk, sizeof(pk)) == 0);
    CHECK(pk_parity == 0);

    /* Choose a secret key such that pubkey and xonly_pubkey are each others
     * negation. */
    sk[0] = 2;
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk, sk) == 1);
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk) == 1);
    CHECK(secp256k1_memcmp_var(&xonly_pk, &pk, sizeof(xonly_pk)) != 0);
    CHECK(pk_parity == 1);
    secp256k1_pubkey_load(CTX, &pk1, &pk);
    secp256k1_pubkey_load(CTX, &pk2, (secp256k1_pubkey *) &xonly_pk);
    CHECK(secp256k1_fe_equal(&pk1.x, &pk2.x) == 1);
    secp256k1_fe_negate(&y, &pk2.y, 1);
    CHECK(secp256k1_fe_equal(&pk1.y, &y) == 1);

    /* Test xonly_pubkey_serialize and xonly_pubkey_parse */
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_serialize(CTX, NULL, &xonly_pk));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_serialize(CTX, buf32, NULL));
    CHECK(secp256k1_memcmp_var(buf32, zeros64, 32) == 0);
    {
        /* A pubkey filled with 0s will fail to serialize due to pubkey_load
         * special casing. */
        secp256k1_xonly_pubkey pk_tmp;
        memset(&pk_tmp, 0, sizeof(pk_tmp));
        /* pubkey_load calls illegal callback */
        CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_serialize(CTX, buf32, &pk_tmp));
    }

    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_parse(CTX, NULL, buf32));
    CHECK_ILLEGAL(CTX, secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, NULL));

    /* Serialization and parse roundtrip */
    CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk) == 1);
    CHECK(secp256k1_xonly_pubkey_serialize(CTX, buf32, &xonly_pk) == 1);
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk_tmp, buf32) == 1);
    CHECK(secp256k1_memcmp_var(&xonly_pk, &xonly_pk_tmp, sizeof(xonly_pk)) == 0);

    /* Test parsing invalid field elements */
    memset(&xonly_pk, 1, sizeof(xonly_pk));
    /* Overflowing field element */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, ones32) == 0);
    CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
    memset(&xonly_pk, 1, sizeof(xonly_pk));
    /* There's no point with x-coordinate 0 on secp256k1 */
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, zeros64) == 0);
    CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
    /* If a random 32-byte string can not be parsed with ec_pubkey_parse
     * (because interpreted as X coordinate it does not correspond to a point on
     * the curve) then xonly_pubkey_parse should fail as well. */
    for (i = 0; i < COUNT; i++) {
        unsigned char rand33[33];
        testrand256(&rand33[1]);
        rand33[0] = SECP256K1_TAG_PUBKEY_EVEN;
        if (!secp256k1_ec_pubkey_parse(CTX, &pk, rand33, 33)) {
            memset(&xonly_pk, 1, sizeof(xonly_pk));
            CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 0);
            CHECK(secp256k1_memcmp_var(&xonly_pk, zeros64, sizeof(xonly_pk)) == 0);
        } else {
            CHECK(secp256k1_xonly_pubkey_parse(CTX, &xonly_pk, &rand33[1]) == 1);
        }
    }
}